

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repair.cpp
# Opt level: O0

int repair_main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 *in_RSI;
  int in_EDI;
  Options *in_stack_00000050;
  string *in_stack_00000058;
  Status status;
  Options options;
  ZlibCompressor zlib;
  ZlibCompressorRaw zlib_raw;
  string path;
  Status *in_stack_fffffffffffff678;
  FILE *__stream;
  Options *in_stack_fffffffffffff680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff688;
  undefined4 in_stack_fffffffffffff6b0;
  undefined4 in_stack_fffffffffffff6b4;
  char *in_stack_fffffffffffff6b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6c0;
  Status *in_stack_fffffffffffff6d8;
  Status local_920 [11];
  undefined1 *local_8c8;
  undefined1 *local_8c0;
  undefined1 local_b8 [40];
  undefined1 local_90 [63];
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [32];
  undefined8 *local_10;
  uint local_4;
  
  local_10 = in_RSI;
  if ((in_EDI < 3) || (iVar2 = strcmp("help",(char *)in_RSI[1]), iVar2 == 0)) {
    printf("Usage: %s repair <minecraft_world_dir>\n",*local_10);
    local_4 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0));
    std::operator+(in_stack_fffffffffffff688,(char *)in_stack_fffffffffffff680);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    leveldb::ZlibCompressorRaw::ZlibCompressorRaw
              ((ZlibCompressorRaw *)in_stack_fffffffffffff680,
               (int)((ulong)in_stack_fffffffffffff678 >> 0x20));
    leveldb::ZlibCompressor::ZlibCompressor
              ((ZlibCompressor *)in_stack_fffffffffffff680,
               (int)((ulong)in_stack_fffffffffffff678 >> 0x20));
    leveldb::Options::Options(in_stack_fffffffffffff680);
    local_8c8 = local_90;
    local_8c0 = local_b8;
    leveldb::Status::Status(local_920);
    leveldb::RepairDB(in_stack_00000058,in_stack_00000050);
    leveldb::Status::operator=((Status *)in_stack_fffffffffffff680,in_stack_fffffffffffff678);
    leveldb::Status::~Status((Status *)in_stack_fffffffffffff680);
    bVar1 = leveldb::Status::ok(local_920);
    if (!bVar1) {
      __stream = _stderr;
      in_stack_fffffffffffff680 = (Options *)std::__cxx11::string::c_str();
      leveldb::Status::ToString_abi_cxx11_(in_stack_fffffffffffff6d8);
      uVar3 = std::__cxx11::string::c_str();
      fprintf(__stream,"ERROR: Repairing \'%s\' failed --- %s\n",in_stack_fffffffffffff680,uVar3);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffff6b8);
    }
    local_4 = (uint)!bVar1;
    leveldb::Status::~Status((Status *)in_stack_fffffffffffff680);
    leveldb::ZlibCompressor::~ZlibCompressor((ZlibCompressor *)0x10d6e4);
    leveldb::ZlibCompressorRaw::~ZlibCompressorRaw((ZlibCompressorRaw *)0x10d6f1);
    std::__cxx11::string::~string(local_30);
  }
  return local_4;
}

Assistant:

int repair_main(int argc, char *argv[]) {
    if(argc < 3 || strcmp("help", argv[1]) == 0) {
        printf("Usage: %s repair <minecraft_world_dir>\n", argv[0]);
        return EXIT_FAILURE;
    }

    // construct path for Minecraft BE database
    std::string path = std::string(argv[2]) + "/db";

    leveldb::ZlibCompressorRaw zlib_raw;
    leveldb::ZlibCompressor zlib;

    leveldb::Options options;
    options.compressors[0] = &zlib_raw;
    options.compressors[1] = &zlib;

    leveldb::Status status;
    status = leveldb::RepairDB(path, options);

    if(!status.ok()) {
        fprintf(stderr, "ERROR: Repairing '%s' failed --- %s\n", path.c_str(),
                status.ToString().c_str());
        return EXIT_FAILURE;
    }
    return EXIT_SUCCESS;
}